

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void shape_lore_append_resistances(textblock *tb,player_shape *s)

{
  int local_2c8;
  wchar_t local_2c4;
  wchar_t i;
  wchar_t nimm;
  wchar_t nres;
  wchar_t nvul;
  char *imm [28];
  char *res [28];
  char *vul [28];
  player_shape *s_local;
  textblock *tb_local;
  
  nimm = L'\0';
  i = L'\0';
  local_2c4 = L'\0';
  for (local_2c8 = 0; local_2c8 < 0x1c; local_2c8 = local_2c8 + 1) {
    if (s->el_info[local_2c8].res_level == 0) {
      *(char **)(&nres + (long)local_2c4 * 2) = projections[local_2c8].name;
      local_2c4 = local_2c4 + L'\x01';
    }
    else if (s->el_info[local_2c8].res_level < 100) {
      imm[(long)i + 0x1b] = projections[local_2c8].name;
      i = i + L'\x01';
    }
    else if (100 < s->el_info[local_2c8].res_level) {
      res[(long)nimm + 0x1b] = projections[local_2c8].name;
      nimm = nimm + L'\x01';
    }
  }
  if (nimm != L'\0') {
    textblock_append(tb,"Makes you vulnerable to");
    shape_lore_append_list(tb,res + 0x1b,nimm);
    textblock_append(tb,".\n");
  }
  if (i != L'\0') {
    textblock_append(tb,"Makes you resistant to");
    shape_lore_append_list(tb,imm + 0x1b,i);
    textblock_append(tb,".\n");
  }
  if (local_2c4 != L'\0') {
    textblock_append(tb,"Makes you immune to");
    shape_lore_append_list(tb,(char **)&nres,local_2c4);
    textblock_append(tb,".\n");
  }
  return;
}

Assistant:

static void shape_lore_append_resistances(textblock *tb,
	const struct player_shape *s)
{
	const char* vul[ELEM_MAX];
	const char* res[ELEM_MAX];
	const char* imm[ELEM_MAX];
	int nvul = 0, nres = 0, nimm = 0;
	int i;

	for (i = 0; i < ELEM_MAX; ++i) {
		if (s->el_info[i].res_level == RES_LEVEL_MAX) {
			imm[nimm] = projections[i].name;
			++nimm;
		} else if (s->el_info[i].res_level < RES_LEVEL_BASE) {
			res[nres] = projections[i].name;
			++nres;
		} else if (s->el_info[i].res_level > RES_LEVEL_BASE) {
			vul[nvul] = projections[i].name;
			++nvul;
		}
	}

	if (nvul != 0) {
		textblock_append(tb, "Makes you vulnerable to");
		shape_lore_append_list(tb, vul, nvul);
		textblock_append(tb, ".\n");
	}

	if (nres != 0) {
		textblock_append(tb, "Makes you resistant to");
		shape_lore_append_list(tb, res, nres);
		textblock_append(tb, ".\n");
	}

	if (nimm != 0) {
		textblock_append(tb, "Makes you immune to");
		shape_lore_append_list(tb, imm, nimm);
		textblock_append(tb, ".\n");
	}
}